

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetPrototype(JSContext *ctx,JSValue obj)

{
  int iVar1;
  JSValueUnion JVar2;
  JSProxyData *argv;
  ulong uVar3;
  JSRefCountHeader *p;
  JSValue func_obj;
  JSValue JVar4;
  JSValue v;
  JSValue JVar5;
  JSValue method;
  
  JVar5.tag = (JSValueUnion)obj.tag;
  if ((int)obj.tag != -1) {
    JVar5.u.ptr = (void *)JVar5.tag;
    v = JS_GetPrototypePrimitive(ctx,JVar5);
    JVar2 = v.u;
    if (0xfffffff4 < (uint)v.tag) {
      *(int *)JVar2.ptr = *JVar2.ptr + 1;
    }
    uVar3 = (ulong)JVar2.ptr & 0xffffffff00000000;
    goto LAB_00119056;
  }
  if (*(short *)((long)obj.u.ptr + 6) != 0x29) {
    JVar2 = (JSValueUnion)((JSValueUnion *)(*(long *)((long)obj.u.ptr + 0x18) + 0x38))->ptr;
    if ((int *)JVar2.ptr == (int *)0x0) {
      v = (JSValue)(ZEXT816(2) << 0x40);
      uVar3 = 0;
    }
    else {
      *(int *)JVar2.ptr = *JVar2.ptr + 1;
      uVar3 = (ulong)JVar2.ptr & 0xffffffff00000000;
      v.tag = -1;
      v.u.ptr = JVar2.ptr;
    }
    goto LAB_00119056;
  }
  argv = get_proxy_method(ctx,&method,obj,0x5f);
  if (argv == (JSProxyData *)0x0) {
LAB_00119122:
    v = (JSValue)(ZEXT816(6) << 0x40);
  }
  else if ((int)method.tag == 3) {
    v = JS_GetPrototype(ctx,argv->target);
  }
  else {
    func_obj.tag = method.tag;
    func_obj.u.float64 = method.u.float64;
    v = JS_CallFree(ctx,func_obj,argv->handler,1,&argv->target);
    iVar1 = (int)v.tag;
    if (iVar1 != 6) {
      if ((iVar1 == 2) || (iVar1 == -1)) {
        iVar1 = JS_IsExtensible(ctx,argv->target);
        if (iVar1 < 0) {
LAB_00119114:
          JS_FreeValue(ctx,v);
          goto LAB_00119122;
        }
        if (iVar1 == 0) {
          JVar5 = JS_GetPrototype(ctx,argv->target);
          if ((int)JVar5.tag == 6) goto LAB_00119114;
          JS_FreeValue(ctx,JVar5);
          if (JVar5.u.ptr != v.u.ptr) goto LAB_0011914a;
        }
      }
      else {
LAB_0011914a:
        JS_FreeValue(ctx,v);
        v = (JSValue)(ZEXT816(6) << 0x40);
        JS_ThrowTypeError(ctx,"proxy: inconsistent prototype");
      }
    }
  }
  uVar3 = (ulong)v.u.ptr & 0xffffffff00000000;
LAB_00119056:
  JVar4.u.ptr = (void *)((ulong)v.u.ptr & 0xffffffff | uVar3);
  JVar4.tag = v.tag;
  return JVar4;
}

Assistant:

JSValue JS_GetPrototype(JSContext *ctx, JSValueConst obj)
{
    JSValue val;
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p;
        p = JS_VALUE_GET_OBJ(obj);
        if (unlikely(p->class_id == JS_CLASS_PROXY)) {
            val = js_proxy_getPrototypeOf(ctx, obj);
        } else {
            p = p->shape->proto;
            if (!p)
                val = JS_NULL;
            else
                val = JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
        }
    } else {
        val = JS_DupValue(ctx, JS_GetPrototypePrimitive(ctx, obj));
    }
    return val;
}